

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

Bond * __thiscall OpenMD::SelectionManager::beginSelectedBond(SelectionManager *this,int *i)

{
  pointer pOVar1;
  Bond *pBVar2;
  bool bVar3;
  int bitIndex;
  
  bitIndex = 0;
  while( true ) {
    *i = bitIndex;
    pOVar1 = (this->ss_).bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((int)((*(int *)&(((_Bit_iterator *)
                         ((long)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x10
                         ))->super__Bit_iterator_base)._M_p -
              *(int *)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_>) * 8 +
             *(uint *)((long)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x18))
        <= bitIndex) {
      return (Bond *)0x0;
    }
    bVar3 = OpenMDBitSet::operator[](pOVar1 + 1,bitIndex);
    if ((bVar3) &&
       (pBVar2 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*i], pBVar2 != (Bond *)0x0)) break;
    bitIndex = *i + 1;
  }
  return pBVar2;
}

Assistant:

Bond* SelectionManager::beginSelectedBond(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].firstOnBit();
    return i == -1 ? NULL : bonds_[i];
#endif
  }